

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O2

int attrset_read_attr_set_v1(BigAttrSet *attrset,char *basename)

{
  long lVar1;
  long lVar2;
  BigAttrSet *attrset_00;
  int iVar3;
  int iVar4;
  FILE *pFVar5;
  size_t sVar6;
  size_t sVar7;
  char *__ptr;
  char *pcVar8;
  char *pcVar9;
  undefined1 auStack_68 [8];
  char local_60 [8];
  char dtype [9];
  int local_44;
  int local_40;
  int nmemb;
  int lname;
  
  attrset->dirty = 0;
  iVar4 = 0;
  unique0x100006fa = attrset;
  pFVar5 = (FILE *)_big_file_open_a_file(basename,-2,"r",0);
  if (pFVar5 != (FILE *)0x0) {
    dtype[0] = '\0';
    local_60[0] = '\0';
    local_60[1] = '\0';
    local_60[2] = '\0';
    local_60[3] = '\0';
    local_60[4] = '\0';
    local_60[5] = '\0';
    local_60[6] = '\0';
    local_60[7] = '\0';
    sVar7 = 4;
    pcVar8 = auStack_68;
    _lname = pFVar5;
    do {
      pcVar8[-8] = -0x22;
      pcVar8[-7] = '6';
      pcVar8[-6] = '\x10';
      pcVar8[-5] = '\0';
      pcVar8[-4] = '\0';
      pcVar8[-3] = '\0';
      pcVar8[-2] = '\0';
      pcVar8[-1] = '\0';
      iVar3 = feof(pFVar5);
      iVar4 = 0;
      pcVar9 = pcVar8;
      if (iVar3 != 0) goto LAB_00103837;
      pcVar8[-8] = -5;
      pcVar8[-7] = '6';
      pcVar8[-6] = '\x10';
      pcVar8[-5] = '\0';
      pcVar8[-4] = '\0';
      pcVar8[-3] = '\0';
      pcVar8[-2] = '\0';
      pcVar8[-1] = '\0';
      sVar6 = fread(&local_44,sVar7,1,pFVar5);
      if (sVar6 != 1) goto LAB_00103837;
      builtin_strncpy(pcVar8 + -8,"\x177\x10",4);
      pcVar8[-4] = '\0';
      pcVar8[-3] = '\0';
      pcVar8[-2] = '\0';
      pcVar8[-1] = '\0';
      sVar7 = fread(&local_40,sVar7,1,pFVar5);
      if (sVar7 != 1) {
LAB_001037f5:
        pcVar9 = "Failed to read from file";
        iVar4 = 0x5b0;
        goto LAB_00103808;
      }
      pcVar8[-8] = '\b';
      pcVar8[-7] = '\0';
      pcVar8[-6] = '\0';
      pcVar8[-5] = '\0';
      pcVar8[-4] = '\0';
      pcVar8[-3] = '\0';
      pcVar8[-2] = '\0';
      pcVar8[-1] = '\0';
      builtin_strncpy(pcVar8 + -8,"27\x10",4);
      pcVar8[-4] = '\0';
      pcVar8[-3] = '\0';
      pcVar8[-2] = '\0';
      pcVar8[-1] = '\0';
      sVar7 = fread(local_60,*(size_t *)(pcVar8 + -8),1,pFVar5);
      if (sVar7 != 1) goto LAB_001037f5;
      builtin_strncpy(pcVar8 + -8,"D7\x10",4);
      pcVar8[-4] = '\0';
      pcVar8[-3] = '\0';
      pcVar8[-2] = '\0';
      pcVar8[-1] = '\0';
      iVar4 = dtype_isvalid(local_60);
      if (iVar4 == 0) goto LAB_001037f5;
      builtin_strncpy(pcVar8 + -8,"T7\x10",4);
      pcVar8[-4] = '\0';
      pcVar8[-3] = '\0';
      pcVar8[-2] = '\0';
      pcVar8[-1] = '\0';
      iVar4 = big_file_dtype_itemsize(local_60);
      nmemb = local_44;
      iVar4 = iVar4 * local_44;
      lVar1 = -((long)iVar4 + 0xfU & 0xfffffffffffffff0);
      __ptr = pcVar8 + lVar1;
      sVar6 = (size_t)local_40;
      lVar2 = -(sVar6 + 0x10 & 0xfffffffffffffff0);
      pcVar9 = __ptr + lVar2;
      pcVar9[-8] = -0x68;
      pcVar9[-7] = '7';
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      sVar7 = fread(pcVar9,sVar6,1,pFVar5);
      pFVar5 = _lname;
      if (sVar7 != 1) {
LAB_00103815:
        builtin_strncpy(pcVar8 + lVar2 + lVar1 + -8,"/8\x10",4);
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        _big_file_raise("Failed to read from file",
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                        ,0x5b8);
        pcVar9[-8] = -1;
        pcVar9[-7] = -1;
        pcVar9[-6] = -1;
        pcVar9[-5] = -1;
        pcVar9[-4] = -1;
        pcVar9[-3] = -1;
        pcVar9[-2] = -1;
        pcVar9[-1] = -1;
        iVar4 = (int)*(undefined8 *)(pcVar9 + -8);
        pFVar5 = _lname;
        goto LAB_00103837;
      }
      pcVar9[-8] = -0x50;
      pcVar9[-7] = '7';
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      sVar7 = fread(__ptr,(long)iVar4,1,pFVar5);
      if (sVar7 != 1) goto LAB_00103815;
      pcVar9[sVar6] = '\0';
      iVar4 = nmemb;
      attrset_00 = stack0xffffffffffffffb0;
      pcVar9[-8] = -0x2b;
      pcVar9[-7] = '7';
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      iVar4 = attrset_set_attr(attrset_00,pcVar9,__ptr,local_60,iVar4);
      pFVar5 = _lname;
      pcVar9[-8] = '\x04';
      pcVar9[-7] = '\0';
      pcVar9[-6] = '\0';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      sVar7 = *(size_t *)(pcVar9 + -8);
      pcVar8 = pcVar9;
    } while (iVar4 == 0);
    pcVar9 = (char *)0x0;
    iVar4 = 0x5bd;
LAB_00103808:
    builtin_strncpy(pcVar8 + -8,"\x0f8\x10",4);
    pcVar8[-4] = '\0';
    pcVar8[-3] = '\0';
    pcVar8[-2] = '\0';
    pcVar8[-1] = '\0';
    _big_file_raise(pcVar9,
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,iVar4);
    pcVar8[-8] = -1;
    pcVar8[-7] = -1;
    pcVar8[-6] = -1;
    pcVar8[-5] = -1;
    pcVar8[-4] = -1;
    pcVar8[-3] = -1;
    pcVar8[-2] = -1;
    pcVar8[-1] = -1;
    iVar4 = (int)*(undefined8 *)(pcVar8 + -8);
    pcVar9 = pcVar8;
LAB_00103837:
    stack0xffffffffffffffb0->dirty = 0;
    builtin_strncpy(pcVar9 + -8,"F8\x10",4);
    pcVar9[-4] = '\0';
    pcVar9[-3] = '\0';
    pcVar9[-2] = '\0';
    pcVar9[-1] = '\0';
    fclose(pFVar5);
  }
  return iVar4;
}

Assistant:

static int
attrset_read_attr_set_v1(BigAttrSet * attrset, const char * basename)
{
    attrset->dirty = 0;

    FILE * fattr = _big_file_open_a_file(basename, FILEID_ATTR, "r", 0);
    if(fattr == NULL) {
        return 0;
    }
    int nmemb;
    int lname;
    char dtype[9]={0};
    char * data;
    char * name;
    while(!feof(fattr)) {
        if(1 != fread(&nmemb, sizeof(int), 1, fattr)) break;
        RAISEIF(
            (1 != fread(&lname, sizeof(int), 1, fattr)) ||
            (1 != fread(&dtype, 8, 1, fattr)) ||
            (!dtype_isvalid(dtype)),
            ex_fread,
            "Failed to read from file"
                )
        int ldata = big_file_dtype_itemsize(dtype) * nmemb;
        data = alloca(ldata);
        name = alloca(lname + 1);
        RAISEIF(
            (1 != fread(name, lname, 1, fattr)) ||
            (1 != fread(data, ldata, 1, fattr)),
            ex_fread,
            "Failed to read from file");

        name[lname] = 0;
        RAISEIF(0 != attrset_set_attr(attrset, name, data, dtype, nmemb),
            ex_set_attr,
            NULL);
    }
    attrset->dirty = 0;
    fclose(fattr);
    return 0;
ex_set_attr:
ex_fread:
    attrset->dirty = 0;
    fclose(fattr);
    return -1;
}